

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp_history.cpp
# Opt level: O0

uint32_t __thiscall
libtorrent::aux::timestamp_history::add_sample(timestamp_history *this,uint32_t sample,bool step)

{
  uint32_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  reference pvVar4;
  iterator pvVar5;
  value_type_conflict1 *h;
  iterator __end3;
  iterator __begin3;
  array<unsigned_int,_20UL> *__range3;
  uint32_t ret;
  bool step_local;
  timestamp_history *ptStack_10;
  uint32_t sample_local;
  timestamp_history *this_local;
  
  ret = sample;
  ptStack_10 = this;
  bVar2 = initialized(this);
  if (!bVar2) {
    ::std::array<unsigned_int,_20UL>::fill(&this->m_history,&ret);
    this->m_base = ret;
    this->m_num_samples = 0;
  }
  if (this->m_num_samples < 0xfffe) {
    this->m_num_samples = this->m_num_samples + 1;
  }
  bVar2 = compare_less_wrap(ret,this->m_base,0xffffffff);
  uVar1 = ret;
  if (bVar2) {
    this->m_base = ret;
    pvVar4 = ::std::array<unsigned_int,_20UL>::operator[](&this->m_history,(ulong)this->m_index);
    *pvVar4 = uVar1;
  }
  else {
    pvVar4 = ::std::array<unsigned_int,_20UL>::operator[](&this->m_history,(ulong)this->m_index);
    bVar2 = compare_less_wrap(uVar1,*pvVar4,0xffffffff);
    uVar1 = ret;
    if (bVar2) {
      pvVar4 = ::std::array<unsigned_int,_20UL>::operator[](&this->m_history,(ulong)this->m_index);
      *pvVar4 = uVar1;
    }
  }
  uVar1 = ret;
  uVar3 = ret - this->m_base;
  if ((step) && (0x78 < this->m_num_samples)) {
    this->m_num_samples = 0;
    this->m_index = (uint16_t)((ulong)(this->m_index + 1) % 0x14);
    pvVar4 = ::std::array<unsigned_int,_20UL>::operator[](&this->m_history,(ulong)this->m_index);
    *pvVar4 = uVar1;
    this->m_base = ret;
    __end3 = ::std::array<unsigned_int,_20UL>::begin(&this->m_history);
    pvVar5 = ::std::array<unsigned_int,_20UL>::end(&this->m_history);
    for (; __end3 != pvVar5; __end3 = __end3 + 1) {
      bVar2 = compare_less_wrap(*__end3,this->m_base,0xffffffff);
      if (bVar2) {
        this->m_base = *__end3;
      }
    }
  }
  return uVar3;
}

Assistant:

std::uint32_t timestamp_history::add_sample(std::uint32_t sample, bool step)
{
	if (!initialized())
	{
		m_history.fill(sample);
		m_base = sample;
		m_num_samples = 0;
	}

	// don't let the counter wrap
	if (m_num_samples < 0xfffe) ++m_num_samples;

	// if sample is less than base, update the base
	// and update the history entry (because it will
	// be less than that too)
	if (compare_less_wrap(sample, m_base, TIME_MASK))
	{
		m_base = sample;
		m_history[m_index] = sample;
	}
	// if sample is less than our history entry, update it
	else if (compare_less_wrap(sample, m_history[m_index], TIME_MASK))
	{
		m_history[m_index] = sample;
	}

	std::uint32_t ret = sample - m_base;

	// don't step base delay history unless we have at least 120
	// samples. Anything less would suggest that the connection is
	// essentially idle and the samples are probably not very reliable
	if (step && m_num_samples > 120)
	{
		m_num_samples = 0;
		m_index = (m_index + 1) % history_size;

		m_history[m_index] = sample;
		// update m_base
		m_base = sample;
		for (auto& h : m_history)
		{
			if (compare_less_wrap(h, m_base, TIME_MASK))
				m_base = h;
		}
	}
	return ret;
}